

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void aes_ecb4x(uchar *out,uint32_t *ivw,uint64_t *sk_exp,uint nrounds)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t w [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puVar5 = &local_c8;
  uVar2 = (ulong)nrounds;
  local_78 = *(undefined8 *)ivw;
  uStack_70 = *(undefined8 *)(ivw + 2);
  local_68 = *(undefined8 *)(ivw + 4);
  uStack_60 = *(undefined8 *)(ivw + 6);
  local_58 = *(undefined8 *)(ivw + 8);
  uStack_50 = *(undefined8 *)(ivw + 10);
  local_48 = *(undefined8 *)(ivw + 0xc);
  uStack_40 = *(undefined8 *)(ivw + 0xe);
  lVar8 = 0;
  do {
    br_aes_ct64_interleave_in(puVar5,puVar5 + 4,(uint32_t *)((long)&local_78 + lVar8));
    lVar8 = lVar8 + 0x10;
    puVar5 = puVar5 + 1;
  } while (lVar8 != 0x40);
  br_aes_ct64_ortho(&local_c8);
  local_c8 = CONCAT44(*(uint *)((long)sk_exp + 4) ^ local_c8._4_4_,(uint)*sk_exp ^ (uint)local_c8);
  uStack_c0 = CONCAT44(*(uint *)((long)sk_exp + 0xc) ^ uStack_c0._4_4_,
                       (uint)sk_exp[1] ^ (uint)uStack_c0);
  local_b8 = CONCAT44(*(uint *)((long)sk_exp + 0x14) ^ local_b8._4_4_,
                      (uint)sk_exp[2] ^ (uint)local_b8);
  uStack_b0 = CONCAT44(*(uint *)((long)sk_exp + 0x1c) ^ uStack_b0._4_4_,
                       (uint)sk_exp[3] ^ (uint)uStack_b0);
  local_a8 = CONCAT44(*(uint *)((long)sk_exp + 0x24) ^ local_a8._4_4_,
                      (uint)sk_exp[4] ^ (uint)local_a8);
  uStack_a0 = CONCAT44(*(uint *)((long)sk_exp + 0x2c) ^ uStack_a0._4_4_,
                       (uint)sk_exp[5] ^ (uint)uStack_a0);
  local_98 = sk_exp[6] ^ local_98;
  uStack_90 = sk_exp[7] ^ uStack_90;
  local_80 = uVar2;
  if (1 < nrounds) {
    uVar3 = 1;
    do {
      br_aes_ct64_bitslice_Sbox(&local_c8);
      lVar8 = 0;
      do {
        uVar6 = (&local_c8)[lVar8];
        uVar7 = (&uStack_c0)[lVar8];
        (&local_c8)[lVar8] =
             (uVar6 & 0xfff000000000000) << 4 |
             uVar6 >> 0xc & 0xf000000000000 | (uVar6 & 0xff00000000) << 8 |
             uVar6 >> 8 & 0xff00000000 | (uVar6 & 0xf0000) << 0xc |
             uVar6 >> 4 & 0xfff0000 | uVar6 & 0xffff;
        (&uStack_c0)[lVar8] =
             (uVar7 & 0xfff000000000000) << 4 |
             uVar7 >> 0xc & 0xf000000000000 | (uVar7 & 0xff00000000) << 8 |
             uVar7 >> 8 & 0xff00000000 | (uVar7 & 0xf0000) << 0xc |
             uVar7 >> 4 & 0xfff0000 | uVar7 & 0xffff;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 8);
      uVar6 = local_c8 << 0x30 | local_c8 >> 0x10;
      uVar4 = uStack_90 << 0x30 | uStack_90 >> 0x10;
      uStack_90 = uStack_90 ^ uVar4;
      uVar9 = local_c8 ^ uVar6;
      local_c8 = uVar6 ^ uStack_90 ^ (uVar9 << 0x20 | uVar9 >> 0x20) ^ sk_exp[uVar3 * 8];
      uVar7 = uStack_c0 << 0x30 | uStack_c0 >> 0x10;
      uVar6 = uStack_c0 ^ uVar7;
      uStack_c0 = uVar9 ^ uStack_90 ^ uVar7 ^
                  (uVar6 << 0x20 | uVar6 >> 0x20) ^ sk_exp[uVar3 * 8 + 1];
      uVar9 = local_b8 << 0x30 | local_b8 >> 0x10;
      uVar7 = local_b8 ^ uVar9;
      local_b8 = uVar6 ^ uVar9 ^ (uVar7 << 0x20 | uVar7 >> 0x20) ^ sk_exp[uVar3 * 8 + 2];
      uVar9 = uStack_b0 << 0x30 | uStack_b0 >> 0x10;
      uVar6 = uStack_b0 ^ uVar9;
      uStack_b0 = uVar7 ^ uStack_90 ^ uVar9 ^
                  (uVar6 << 0x20 | uVar6 >> 0x20) ^ sk_exp[uVar3 * 8 + 3];
      uVar9 = local_a8 << 0x30 | local_a8 >> 0x10;
      uVar7 = local_a8 ^ uVar9;
      local_a8 = uVar6 ^ uStack_90 ^ uVar9 ^ (uVar7 << 0x20 | uVar7 >> 0x20) ^ sk_exp[uVar3 * 8 + 4]
      ;
      uVar9 = uStack_a0 << 0x30 | uStack_a0 >> 0x10;
      uVar6 = uStack_a0 ^ uVar9;
      uStack_a0 = uVar7 ^ uVar9 ^ (uVar6 << 0x20 | uVar6 >> 0x20) ^ sk_exp[uVar3 * 8 + 5];
      uVar7 = local_98 << 0x30 | local_98 >> 0x10;
      uVar9 = local_98 ^ uVar7;
      local_98 = uVar6 ^ uVar7 ^ (uVar9 << 0x20 | uVar9 >> 0x20) ^ sk_exp[uVar3 * 8 + 6];
      uStack_90 = uVar9 ^ uVar4 ^ (uStack_90 << 0x20 | uStack_90 >> 0x20) ^ sk_exp[uVar3 * 8 + 7];
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  br_aes_ct64_bitslice_Sbox(&local_c8);
  lVar8 = 0;
  do {
    uVar2 = (&local_c8)[lVar8];
    uVar3 = (&uStack_c0)[lVar8];
    (&local_c8)[lVar8] =
         (uVar2 & 0xfff000000000000) << 4 |
         uVar2 >> 0xc & 0xf000000000000 | (uVar2 & 0xff00000000) << 8 |
         uVar2 >> 8 & 0xff00000000 | (uVar2 & 0xf0000) << 0xc |
         uVar2 >> 4 & 0xfff0000 | uVar2 & 0xffff;
    (&uStack_c0)[lVar8] =
         (uVar3 & 0xfff000000000000) << 4 |
         uVar3 >> 0xc & 0xf000000000000 | (uVar3 & 0xff00000000) << 8 |
         uVar3 >> 8 & 0xff00000000 | (uVar3 & 0xf0000) << 0xc |
         uVar3 >> 4 & 0xfff0000 | uVar3 & 0xffff;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 8);
  uVar2 = (ulong)(uint)((int)local_80 << 3);
  puVar5 = sk_exp + uVar2;
  local_c8 = CONCAT44(*(uint *)((long)puVar5 + 4) ^ local_c8._4_4_,(uint)*puVar5 ^ (uint)local_c8);
  uStack_c0 = CONCAT44(*(uint *)((long)puVar5 + 0xc) ^ uStack_c0._4_4_,
                       (uint)puVar5[1] ^ (uint)uStack_c0);
  puVar5 = sk_exp + uVar2 + 2;
  local_b8 = CONCAT44(*(uint *)((long)puVar5 + 4) ^ local_b8._4_4_,(uint)*puVar5 ^ (uint)local_b8);
  uStack_b0 = CONCAT44(*(uint *)((long)puVar5 + 0xc) ^ uStack_b0._4_4_,
                       (uint)puVar5[1] ^ (uint)uStack_b0);
  puVar5 = sk_exp + uVar2 + 4;
  local_a8 = CONCAT44(*(uint *)((long)puVar5 + 4) ^ local_a8._4_4_,(uint)*puVar5 ^ (uint)local_a8);
  uStack_a0 = CONCAT44(*(uint *)((long)puVar5 + 0xc) ^ uStack_a0._4_4_,
                       (uint)puVar5[1] ^ (uint)uStack_a0);
  puVar5 = sk_exp + uVar2 + 6;
  local_98 = CONCAT44(*(uint *)((long)puVar5 + 4) ^ local_98._4_4_,(uint)*puVar5 ^ (uint)local_98);
  uStack_90 = CONCAT44(*(uint *)((long)puVar5 + 0xc) ^ uStack_90._4_4_,
                       (uint)puVar5[1] ^ (uint)uStack_90);
  br_aes_ct64_ortho(&local_c8);
  lVar8 = 0;
  do {
    uVar2 = *(ulong *)((long)&local_c8 + lVar8);
    uVar3 = *(ulong *)((long)&uStack_c0 + lVar8);
    uVar6 = *(ulong *)((long)&local_a8 + lVar8);
    uVar7 = *(ulong *)((long)&uStack_a0 + lVar8);
    uVar4 = uVar2 & 0xff000000ff00 | uVar2 >> 8 & 0xff000000ff0000;
    uVar9 = uVar3 & 0xff000000ff00 | uVar3 >> 8 & 0xff000000ff0000;
    uVar10 = uVar6 & 0xff000000ff00 | uVar6 >> 8 & 0xff000000ff0000;
    uVar11 = uVar7 & 0xff000000ff00 | uVar7 >> 8 & 0xff000000ff0000;
    uVar12 = ((uVar2 & 0xff00ff00ff00ff) >> 8 | uVar2 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar13 = ((uVar3 & 0xff00ff00ff00ff) >> 8 | uVar3 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar2 = ((uVar6 & 0xff00ff00ff00ff) >> 8 | uVar6 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar3 = ((uVar7 & 0xff00ff00ff00ff) >> 8 | uVar7 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    lVar1 = lVar8 * 2;
    *(uint *)((long)&local_68 + lVar1) = (uint)(uVar13 >> 0x10) | (uint)uVar13;
    *(uint *)((long)&local_68 + lVar1 + 4) = (uint)(uVar3 >> 0x10) | (uint)uVar3;
    *(uint *)((long)&uStack_60 + lVar1) = (uint)(uVar9 >> 0x18) | (uint)(uVar9 >> 8);
    *(uint *)((long)&uStack_60 + lVar1 + 4) = (uint)(uVar11 >> 0x18) | (uint)(uVar11 >> 8);
    lVar1 = lVar8 * 2;
    *(uint *)((long)&local_78 + lVar1) = (uint)(uVar12 >> 0x10) | (uint)uVar12;
    *(uint *)((long)&local_78 + lVar1 + 4) = (uint)(uVar2 >> 0x10) | (uint)uVar2;
    *(uint *)((long)&uStack_70 + lVar1) = (uint)(uVar4 >> 0x18) | (uint)(uVar4 >> 8);
    *(uint *)((long)&uStack_70 + lVar1 + 4) = (uint)(uVar10 >> 0x18) | (uint)(uVar10 >> 8);
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x20);
  lVar8 = 0;
  do {
    *(undefined4 *)(out + lVar8 * 4) = *(undefined4 *)((long)&local_78 + lVar8 * 4);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10);
  return;
}

Assistant:

static void aes_ecb4x(unsigned char out[64], const uint32_t ivw[16], const uint64_t *sk_exp, unsigned int nrounds) {
    uint32_t w[16];
    uint64_t q[8];
    unsigned int i;

    memcpy(w, ivw, sizeof(w));
    for (i = 0; i < 4; i++) {
        br_aes_ct64_interleave_in(&q[i], &q[i + 4], w + (i << 2));
    }
    br_aes_ct64_ortho(q);


    add_round_key(q, sk_exp);
    for (i = 1; i < nrounds; i++) {
        br_aes_ct64_bitslice_Sbox(q);
        shift_rows(q);
        mix_columns(q);
        add_round_key(q, sk_exp + (i << 3));
    }
    br_aes_ct64_bitslice_Sbox(q);
    shift_rows(q);
    add_round_key(q, sk_exp + 8 * nrounds);

    br_aes_ct64_ortho(q);
    for (i = 0; i < 4; i ++) {
        br_aes_ct64_interleave_out(w + (i << 2), q[i], q[i + 4]);
    }
    br_range_enc32le(out, w, 16);
}